

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_archive.cpp
# Opt level: O3

void __thiscall
boost::archive::json_archive::push_obj_repository
          (json_archive *this,uint32_t class_id,uint32_t obj_id)

{
  pointer *pppbVar1;
  size_type *psVar2;
  iterator __position;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint32_t uVar7;
  iterator __position_00;
  size_type *local_50;
  string __str;
  
  __position_00._M_current =
       (this->data_stack_).
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  iVar6 = (int)((ulong)((long)__position_00._M_current -
                       (long)(this->data_stack_).
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_50 = (size_type *)CONCAT44(local_50._4_4_,iVar6);
  __position._M_current =
       (this->data_mark_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->data_mark_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->data_mark_,__position,(int *)&local_50);
    __position_00._M_current =
         (this->data_stack_).
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = iVar6;
    (this->data_mark_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = __position._M_current + 1;
  }
  if (__position_00._M_current ==
      (this->data_stack_).
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>
    ::
    _M_realloc_insert<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*const&>
              ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>
                *)this,__position_00,&this->obj_repository_);
  }
  else {
    *__position_00._M_current = this->obj_repository_;
    pppbVar1 = &(this->data_stack_).
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppbVar1 = *pppbVar1 + 1;
  }
  cVar5 = '\x01';
  if (9 < class_id) {
    uVar7 = class_id;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar7 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0014273f;
      }
      if (uVar7 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0014273f;
      }
      if (uVar7 < 10000) goto LAB_0014273f;
      bVar3 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_0014273f:
  psVar2 = &__str._M_string_length;
  local_50 = psVar2;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_50,(uint)__str._M_dataplus._M_p,class_id);
  push_data(this,(char *)local_50);
  if (local_50 != psVar2) {
    operator_delete(local_50);
  }
  cVar5 = '\x01';
  if (9 < obj_id) {
    uVar7 = obj_id;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar7 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_001427d2;
      }
      if (uVar7 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_001427d2;
      }
      if (uVar7 < 10000) goto LAB_001427d2;
      bVar3 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_001427d2:
  local_50 = psVar2;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_50,(uint)__str._M_dataplus._M_p,obj_id);
  push_data(this,(char *)local_50);
  if (local_50 != psVar2) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void json_archive::push_obj_repository(const uint32_t class_id, const uint32_t obj_id)
{
    data_mark_.push_back(data_stack_.size());
    data_stack_.push_back(obj_repository_);

    push_data(std::to_string(class_id).c_str());
    push_data(std::to_string(obj_id).c_str());
}